

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void ForEachSortedOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  TidyOption p_Var1;
  uint uVar2;
  ulong uVar3;
  long *plVar4;
  TidyIterator pos;
  AllOption_t tOption;
  OptionDesc local_3a0;
  TidyOption local_320;
  long local_318 [95];
  
  local_3a0.name = (ctmbstr)tidyGetOptionList(tdoc);
  uVar3 = 0;
  if ((TidyIterator)local_3a0.name != (TidyIterator)0x0) {
    do {
      p_Var1 = tidyGetNextOption(tdoc,(TidyIterator *)&local_3a0);
      local_318[uVar3 - 1] = (long)p_Var1;
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((TidyIterator)local_3a0.name != (TidyIterator)0x0);
    uVar3 = (ulong)uVar2;
  }
  local_318[uVar3 - 1] = 0;
  qsort(&local_320,0x5f,8,cmpOpt);
  if (local_320 != (TidyOption)0x0) {
    plVar4 = local_318;
    do {
      GetOption(tdoc,local_320,&local_3a0);
      (*OptionPrint)(tdoc,(TidyOption)plVar4[-1],&local_3a0);
      local_320 = (TidyOption)*plVar4;
      plVar4 = plVar4 + 1;
    } while (local_320 != (TidyOption)0x0);
  }
  return;
}

Assistant:

static void ForEachSortedOption( TidyDoc tdoc, OptionFunc OptionPrint )
{
    AllOption_t tOption;
    const TidyOption *topt;

    getSortedOption( tdoc, &tOption );
    for( topt = tOption.topt; *topt; ++topt)
    {
        OptionDesc d;

        GetOption( tdoc, *topt, &d );
        (*OptionPrint)( tdoc, *topt, &d );
    }
}